

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O1

void __thiscall tonk::SDKConnection::SetSelfReference(SDKConnection *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  std::__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tonk::SDKConnection,void>
            ((__shared_ptr<tonk::SDKConnection,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<tonk::SDKConnection>);
  p_Var2 = p_Stack_20;
  peVar1 = local_28;
  local_28 = (element_type *)0x0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->SelfReference).
            super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->SelfReference).super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->SelfReference).super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  return;
}

Assistant:

void SetSelfReference()
    {
        SelfReference = shared_from_this();
    }